

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int read_header(archive_read *a,archive_entry *entry)

{
  char cVar1;
  mtree *mtree;
  __mode_t p;
  int iVar2;
  int iVar3;
  mode_t mVar4;
  mtree_entry *pmVar5;
  int *piVar6;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar7;
  archive_string *paVar8;
  size_t sVar9;
  mtree_entry **ppmVar10;
  ulong uVar11;
  archive_rb_node *paVar12;
  archive_rb_node *paVar13;
  size_t len;
  mtree_entry *pmVar14;
  la_int64_t lVar15;
  char *pcVar16;
  byte *pbVar17;
  char *pcVar18;
  size_t sVar19;
  __dev_t _Var20;
  ulong uVar21;
  ulong uVar22;
  mtree_option *pmVar23;
  char *pcVar24;
  mtree_entry *pmVar25;
  long lVar26;
  uint uVar27;
  mtree_entry *pmVar28;
  ulong local_118;
  uint local_10c;
  mtree_option *global;
  mtree_entry *local_100;
  mtree_entry *local_f8;
  mtree_entry *local_f0;
  int local_e4;
  archive_rb_tree *local_e0;
  long local_d8;
  archive_entry *sparse_entry;
  mtree_entry **local_c8;
  stat st_storage;
  
  mtree = (mtree *)a->format->data;
  if (-1 < mtree->fd) {
    close(mtree->fd);
    mtree->fd = -1;
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      return -0x1e;
    }
    local_c8 = &mtree->entries;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = 0x80000;
    mtree->archive_format_name = "mtree";
    global = (mtree_option *)0x0;
    detect_form(a,(int *)&sparse_entry);
    local_e0 = &mtree->rbtree;
    local_f8 = (mtree_entry *)0x0;
    local_d8 = 1;
LAB_003225bb:
    lVar26 = 0;
    local_118 = 0;
    while (__s = __archive_read_ahead(a,1,(ssize_t *)&st_storage), _Var20 = st_storage.st_dev,
          __s != (void *)0x0) {
      if ((long)st_storage.st_dev < 0) {
LAB_00322cf0:
        uVar21 = 0xffffffffffffffe2;
        goto LAB_00322cf3;
      }
      pvVar7 = memchr(__s,10,st_storage.st_dev);
      if (pvVar7 != (void *)0x0) {
        _Var20 = (long)pvVar7 + (1 - (long)__s);
        st_storage.st_dev = _Var20;
      }
      if (0xffff < (long)(_Var20 + local_118)) {
        pcVar16 = "Line too long";
        iVar2 = 0x54;
LAB_00322ce3:
        archive_set_error(&a->archive,iVar2,pcVar16);
        goto LAB_00322cf0;
      }
      paVar8 = archive_string_ensure((archive_string *)mtree,_Var20 + local_118 + 1);
      if (paVar8 == (archive_string *)0x0) {
        pcVar16 = "Can\'t allocate working buffer";
        iVar2 = 0xc;
        goto LAB_00322ce3;
      }
      memcpy((mtree->line).s + local_118,__s,st_storage.st_dev);
      __archive_read_consume(a,st_storage.st_dev);
      _Var20 = st_storage.st_dev;
      uVar21 = local_118 + st_storage.st_dev;
      (mtree->line).s[uVar21] = '\0';
      pmVar25 = (mtree_entry *)(mtree->line).s;
      pcVar16 = (char *)((long)(pmVar25->rbnode).rb_nodes + lVar26);
LAB_00322686:
      cVar1 = *pcVar16;
      if (cVar1 == '#') {
        if (pvVar7 == (void *)0x0) goto LAB_003226c9;
LAB_003226b7:
        pcVar16 = pcVar16 + 1;
        goto LAB_00322686;
      }
      if (cVar1 != '\\') {
        if (cVar1 == '\0') goto LAB_003226c9;
        if (cVar1 == '\n') {
          if (uVar21 == 0) break;
          if ((long)uVar21 < 0) goto LAB_00322cf3;
          lVar26 = 0;
          pmVar5 = pmVar25;
          goto LAB_003226ed;
        }
        goto LAB_003226b7;
      }
      if (pcVar16[1] == '\0') goto LAB_003226b7;
      if (pcVar16[1] != '\n') {
        pcVar16 = pcVar16 + 1;
        goto LAB_003226b7;
      }
      *(char *)((long)(pmVar25->rbnode).rb_nodes + (uVar21 - 2)) = '\0';
      uVar21 = uVar21 - 2;
      pmVar25 = (mtree_entry *)(mtree->line).s;
LAB_003226c9:
      lVar26 = (long)pcVar16 - (long)pmVar25;
      local_118 = uVar21;
    }
    mtree->this_entry = mtree->entries;
    uVar21 = 0;
    goto LAB_00322cf3;
  }
LAB_003221ad:
  (a->archive).archive_format = mtree->archive_format;
  (a->archive).archive_format_name = mtree->archive_format_name;
  paVar8 = &mtree->current_dir;
  pmVar25 = (mtree_entry *)&mtree->rbtree;
  pmVar5 = mtree->this_entry;
  local_100 = pmVar25;
  do {
    if (pmVar5 == (mtree_entry *)0x0) {
      return 1;
    }
    pcVar16 = pmVar5->name;
    if (((*pcVar16 == '.') && (pcVar16[1] == '.')) && (pcVar16[2] == '\0')) {
      pmVar5->used = '\x01';
      sVar19 = (mtree->current_dir).length;
      if (sVar19 != 0) {
        pcVar16 = paVar8->s;
        pcVar18 = pcVar16 + sVar19;
        do {
          pcVar24 = pcVar18;
          pcVar18 = pcVar24 + -1;
          if (pcVar18 < pcVar16) break;
        } while (*pcVar18 != '/');
        pcVar24 = pcVar24 + -2;
        if (pcVar18 < pcVar16) {
          pcVar24 = pcVar18;
        }
        (mtree->current_dir).length = (size_t)(pcVar24 + (1 - (long)pcVar16));
      }
    }
    else if (pmVar5->used == '\0') {
      pmVar5->used = '\x01';
      global = (mtree_option *)entry;
      archive_entry_set_filetype(entry,0x8000);
      archive_entry_set_size(entry,0);
      (mtree->contents_name).length = 0;
      local_10c = 0;
      iVar2 = parse_line(a,entry,mtree,pmVar5,(int *)&local_10c);
      if (pmVar5->full == '\0') {
        sVar19 = (mtree->current_dir).length;
        if (sVar19 != 0) {
          archive_strcat(paVar8,"/");
        }
        archive_strcat(paVar8,pmVar5->name);
        archive_entry_copy_pathname(entry,paVar8->s);
        mVar4 = archive_entry_filetype(entry);
        pmVar25 = local_100;
        if (mVar4 != 0x4000) {
          (mtree->current_dir).length = sVar19;
        }
      }
      else {
        archive_entry_copy_pathname(entry,pmVar5->name);
        for (pmVar5 = (mtree_entry *)
                      __archive_rb_tree_find_node((archive_rb_tree *)pmVar25,pmVar5->name);
            pmVar5 != (mtree_entry *)0x0; pmVar5 = pmVar5->next_dup) {
          if ((pmVar5->full != '\0') && (pmVar5->used == '\0')) {
            pmVar5->used = '\x01';
            iVar3 = parse_line(a,entry,mtree,pmVar5,(int *)&local_10c);
            if (iVar3 < iVar2) {
              iVar2 = iVar3;
            }
          }
        }
      }
      if (mtree->checkfs == '\0') goto LAB_00322c80;
      mtree->fd = -1;
      if ((mtree->contents_name).length == 0) {
        pcVar16 = archive_entry_pathname(entry);
      }
      else {
        pcVar16 = (mtree->contents_name).s;
      }
      mVar4 = archive_entry_filetype(entry);
      if ((mVar4 == 0x8000) || (mVar4 = archive_entry_filetype(entry), mVar4 == 0x4000)) {
        iVar3 = open(pcVar16,0x80000);
        mtree->fd = iVar3;
        __archive_ensure_cloexec_flag(iVar3);
        iVar3 = mtree->fd;
        if (iVar3 == -1) {
          piVar6 = __errno_location();
          if ((*piVar6 != 2) || ((mtree->contents_name).length != 0)) {
            archive_set_error(&a->archive,*piVar6,"Can\'t open %s",pcVar16);
            iVar2 = -0x14;
          }
          goto LAB_0032238f;
        }
      }
      else {
LAB_0032238f:
        iVar3 = mtree->fd;
      }
      if (iVar3 < 0) {
        iVar3 = lstat(pcVar16,(stat *)&st_storage);
        if (iVar3 == -1) goto LAB_0032241f;
LAB_003223e4:
        p = st_storage.st_mode;
        uVar27 = st_storage.st_mode & 0xf000;
        if (uVar27 == 0xa000) {
          mVar4 = archive_entry_filetype(entry);
          if (mVar4 != 0xa000) goto LAB_0032248d;
        }
        else if ((uVar27 != 0x8000) || (mVar4 = archive_entry_filetype(entry), mVar4 != 0x8000)) {
LAB_0032248d:
          if (((~p & 0xc000) != 0) || (mVar4 = archive_entry_filetype(entry), mVar4 != 0xc000)) {
            switch(uVar27 - 0x1000 >> 0xc) {
            case 0:
              mVar4 = archive_entry_filetype(entry);
              if (mVar4 == 0x1000) goto LAB_00322b4f;
              break;
            case 1:
              mVar4 = archive_entry_filetype(entry);
              if (mVar4 == 0x2000) goto LAB_00322b4f;
              break;
            case 3:
              mVar4 = archive_entry_filetype(entry);
              if (mVar4 == 0x4000) goto LAB_00322b4f;
              break;
            case 5:
              mVar4 = archive_entry_filetype(entry);
              if (mVar4 == 0x6000) goto LAB_00322b4f;
            }
            if (-1 < mtree->fd) {
              close(mtree->fd);
            }
            mtree->fd = -1;
            if ((local_10c & 0x800) == 0) {
              if (iVar2 != 0) {
                return iVar2;
              }
              pcVar16 = archive_entry_pathname(entry);
              archive_set_error(&a->archive,-1,"mtree specification has different type for %s",
                                pcVar16);
              return -0x14;
            }
            goto LAB_0032253a;
          }
        }
LAB_00322b4f:
        uVar27 = local_10c;
        if (((local_10c & 0x1001) != 1) &&
           ((mVar4 = archive_entry_filetype(entry), mVar4 == 0x2000 ||
            (mVar4 = archive_entry_filetype(entry), mVar4 == 0x6000)))) {
          archive_entry_set_rdev(entry,st_storage.st_rdev);
        }
        if ((uVar27 & 0xc) == 0 || (uVar27 >> 0xc & 1) != 0) {
          archive_entry_set_gid(entry,(ulong)st_storage.st_gid);
        }
        if ((uVar27 & 0x600) == 0 || (uVar27 >> 0xc & 1) != 0) {
          archive_entry_set_uid(entry,(ulong)st_storage.st_uid);
        }
        if ((uVar27 & 0x1010) != 0x10) {
          archive_entry_set_mtime(entry,st_storage.st_mtim.tv_sec,st_storage.st_mtim.tv_nsec);
        }
        if ((uVar27 & 0x1020) != 0x20) {
          archive_entry_set_nlink(entry,(uint)st_storage.st_nlink);
        }
        if ((uVar27 & 0x1040) != 0x40) {
          archive_entry_set_perm(entry,p);
        }
        if ((uVar27 & 0x1080) != 0x80) {
          archive_entry_set_size(entry,st_storage.st_size);
        }
        archive_entry_set_ino(entry,st_storage.st_ino);
        archive_entry_set_dev(entry,st_storage.st_dev);
        archive_entry_linkify(mtree->resolver,(archive_entry **)&global,&sparse_entry);
        entry = (archive_entry *)global;
LAB_00322c80:
        lVar15 = archive_entry_size(entry);
        mtree->cur_size = lVar15;
        mtree->offset = 0;
        return iVar2;
      }
      iVar3 = fstat(iVar3,(stat *)&st_storage);
      if (iVar3 != -1) goto LAB_003223e4;
      piVar6 = __errno_location();
      archive_set_error(&a->archive,*piVar6,"Could not fstat %s",pcVar16);
      close(mtree->fd);
      mtree->fd = -1;
      iVar2 = -0x14;
LAB_0032241f:
      if ((local_10c & 0x800) == 0) goto LAB_00322c80;
LAB_0032253a:
      pmVar5 = mtree->this_entry;
    }
    pmVar5 = pmVar5->next;
    mtree->this_entry = pmVar5;
  } while( true );
LAB_003226ed:
  pmVar5 = (mtree_entry *)((long)(pmVar5->rbnode).rb_nodes + 1);
  uVar21 = (ulong)*(byte *)((long)(pmVar25->rbnode).rb_nodes + lVar26);
  if (0x2f < uVar21) goto LAB_00322836;
  if ((0x100000200U >> (uVar21 & 0x3f) & 1) == 0) {
    if ((0x800002401U >> (uVar21 & 0x3f) & 1) != 0) goto LAB_0032271a;
    if (uVar21 == 0x2f) {
      uVar21 = (st_storage.st_dev + local_118) - lVar26;
      if (4 < (long)uVar21) {
        pcVar16 = (char *)((long)(pmVar25->rbnode).rb_nodes + lVar26);
        iVar2 = strncmp(pcVar16,"/set",4);
        if (iVar2 == 0) {
          cVar1 = *(char *)((long)(pmVar25->rbnode).rb_nodes + lVar26 + 4);
          if ((cVar1 == ' ') || (cVar1 == '\t')) {
            pcVar16 = (char *)((long)(pmVar25->rbnode).rb_nodes + lVar26 + 4);
            goto LAB_0032294b;
          }
        }
        else if (((6 < uVar21) && (iVar2 = strncmp(pcVar16,"/unset",6), iVar2 == 0)) &&
                ((cVar1 = *(char *)((long)(pmVar25->rbnode).rb_nodes + lVar26 + 6), cVar1 == ' ' ||
                 (cVar1 == '\t')))) {
          pcVar18 = (char *)((long)(pmVar25->rbnode).rb_nodes + lVar26 + 6);
          pcVar16 = strchr(pcVar18,0x3d);
          if (pcVar16 == (char *)0x0) goto LAB_00322816;
          pcVar16 = "/unset shall not contain `=\'";
          iVar2 = -1;
          goto LAB_00322d66;
        }
      }
      archive_set_error(&a->archive,0x54,"Can\'t parse line %ju",local_d8);
      goto LAB_00322d70;
    }
    goto LAB_00322836;
  }
  lVar26 = lVar26 + 1;
  goto LAB_003226ed;
LAB_0032294b:
  sVar9 = strspn(pcVar16," \t\r\n");
  if (pcVar16[sVar9] == '\0') goto LAB_0032271a;
  pcVar24 = pcVar16 + sVar9;
  sVar9 = strcspn(pcVar24," \t\r\n");
  pcVar16 = pcVar24 + sVar9;
  pcVar18 = strchr(pcVar24,0x3d);
  sVar19 = (long)pcVar18 - (long)pcVar24;
  if (pcVar16 < pcVar18) {
    sVar19 = sVar9;
  }
  remove_option(&global,pcVar24,sVar19);
  uVar27 = add_option(a,&global,pcVar24,sVar9);
  if (uVar27 != 0) goto LAB_00322d28;
  goto LAB_0032294b;
LAB_00322816:
  while( true ) {
    sVar9 = strspn(pcVar18," \t\r\n");
    cVar1 = pcVar18[sVar9];
    if (cVar1 == '\0') break;
    pcVar18 = pcVar18 + sVar9;
    sVar9 = strcspn(pcVar18," \t\r\n");
    if (((cVar1 == 'a' && sVar9 == 3) && (pcVar18[1] == 'l')) && (pcVar18[2] == 'l')) {
      free_options(global);
      global = (mtree_option *)0x0;
    }
    else {
      remove_option(&global,pcVar18,sVar9);
    }
    pcVar18 = pcVar18 + sVar9;
  }
LAB_0032271a:
  local_d8 = local_d8 + 1;
  goto LAB_003225bb;
LAB_00322836:
  local_e4 = (int)sparse_entry;
  local_100 = (mtree_entry *)malloc(0x40);
  if (local_100 != (mtree_entry *)0x0) {
    pmVar28 = (mtree_entry *)((long)(pmVar25->rbnode).rb_nodes + lVar26);
    uVar21 = (_Var20 + local_118) - lVar26;
    *(undefined8 *)((long)&local_100->options + 2) = 0;
    *(undefined8 *)((long)&local_100->name + 2) = 0;
    local_100->next = (mtree_entry *)0x0;
    local_100->options = (mtree_option *)0x0;
    ppmVar10 = &local_f8->next;
    if (local_f8 == (mtree_entry *)0x0) {
      ppmVar10 = local_c8;
    }
    *ppmVar10 = local_100;
    local_f0 = local_100;
    if (local_e4 == 0) {
      pcVar16 = (char *)strcspn((char *)pmVar28," \t\r\n");
      pmVar25 = (mtree_entry *)(pcVar16 + (long)((long)(pmVar25->rbnode).rb_nodes + lVar26));
      local_f8 = (mtree_entry *)(uVar21 + (long)pmVar25);
    }
    else {
      uVar11 = (long)uVar21 >> 0x3f & uVar21;
      pbVar17 = (byte *)((long)(pmVar25->rbnode).rb_nodes + _Var20 + local_118);
      while (((pbVar17 = pbVar17 + -1, uVar22 = uVar11, 0 < (long)uVar21 &&
              (uVar22 = uVar21, (ulong)*pbVar17 < 0x21)) &&
             ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) != 0))) {
        uVar21 = uVar21 - 1;
      }
      uVar21 = 0;
      local_f8 = pmVar28;
      if (0 < (long)uVar22) {
        uVar21 = uVar22;
      }
      while (uVar21 != 0) {
        if (((ulong)(byte)pmVar5[-1].field_0x3f < 0x21) &&
           ((0x100002600U >> ((ulong)(byte)pmVar5[-1].field_0x3f & 0x3f) & 1) != 0)) {
          local_f8 = pmVar5;
        }
        pmVar5 = (mtree_entry *)((long)(pmVar5->rbnode).rb_nodes + 1);
        uVar21 = uVar21 - 1;
      }
      pcVar16 = (char *)((long)pmVar25 + lVar26 + (uVar22 - (long)local_f8));
      pmVar25 = pmVar28;
      pmVar28 = local_f8;
    }
    pcVar18 = (char *)malloc((size_t)(pcVar16 + 1));
    pmVar5 = local_f0;
    local_f0->name = pcVar18;
    if (pcVar18 != (char *)0x0) {
      memcpy(pcVar18,pmVar28,(size_t)pcVar16);
      pcVar18[(long)pcVar16] = '\0';
      parse_escapes(pcVar18,pmVar5);
      pmVar28 = local_100;
      pmVar5->next_dup = (mtree_entry *)0x0;
      if ((pmVar5->full != '\0') &&
         (iVar2 = __archive_rb_tree_insert_node(local_e0,&pmVar5->rbnode), iVar2 == 0)) {
        paVar12 = __archive_rb_tree_find_node(local_e0,pmVar5->name);
        do {
          paVar13 = paVar12;
          paVar12 = paVar13[1].rb_nodes[0];
        } while (paVar12 != (archive_rb_node *)0x0);
        paVar13[1].rb_nodes[0] = &pmVar5->rbnode;
      }
      pmVar23 = (mtree_option *)&global;
      while (pmVar23 = pmVar23->next, pmVar5 = (mtree_entry *)&pmVar28->options,
            pmVar23 != (mtree_option *)0x0) {
        pcVar16 = pmVar23->value;
        sVar9 = strlen(pcVar16);
        iVar2 = add_option(a,&pmVar28->options,pcVar16,sVar9);
        if (iVar2 != 0) goto LAB_00322cf8;
      }
      while ((local_100 = pmVar5, sVar9 = strspn((char *)pmVar25," \t\r\n"),
             *(char *)((long)(pmVar25->rbnode).rb_nodes + sVar9) != '\0' &&
             (pmVar5 = (mtree_entry *)((long)(pmVar25->rbnode).rb_nodes + sVar9), pmVar5 < local_f8)
             )) {
        len = strcspn((char *)pmVar5," \t\r\n");
        pmVar25 = (mtree_entry *)((long)(pmVar5->rbnode).rb_nodes + len);
        pmVar14 = (mtree_entry *)strchr((char *)pmVar5,0x3d);
        pmVar28 = local_100;
        sVar9 = (long)pmVar14 - (long)pmVar5;
        if (pmVar25 < pmVar14) {
          sVar9 = len;
        }
        if (pmVar14 == (mtree_entry *)0x0) {
          sVar9 = len;
        }
        remove_option((mtree_option **)local_100,(char *)pmVar5,sVar9);
        uVar27 = add_option(a,(mtree_option **)pmVar28,(char *)pmVar5,len);
        pmVar5 = local_100;
        if (uVar27 != 0) goto LAB_00322d28;
      }
      local_f8 = local_f0;
      goto LAB_0032271a;
    }
  }
  piVar6 = __errno_location();
  iVar2 = *piVar6;
  pcVar16 = "Can\'t allocate memory";
LAB_00322d66:
  archive_set_error(&a->archive,iVar2,pcVar16);
LAB_00322d70:
  iVar2 = -0x1e;
  goto LAB_00322cf8;
LAB_00322d28:
  uVar21 = (ulong)uVar27;
LAB_00322cf3:
  iVar2 = (int)uVar21;
LAB_00322cf8:
  free_options(global);
  if (iVar2 != 0) {
    return iVar2;
  }
  goto LAB_003221ad;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry,
            char head_type)
{
  const void *h;
  const char *p, *endp;
  struct rar *rar;
  struct rar_header rar_header;
  struct rar_file_header file_header;
  int64_t header_size;
  unsigned filename_size, end;
  char *filename;
  char *strp;
  char packed_size[8];
  char unp_size[8];
  int ttime;
  struct archive_string_conv *sconv, *fn_sconv;
  unsigned long crc32_val;
  int ret = (ARCHIVE_OK), ret2;

  rar = (struct rar *)(a->format->data);

  /* Setup a string conversion object for non-rar-unicode filenames. */
  sconv = rar->opt_sconv;
  if (sconv == NULL) {
    if (!rar->init_default_conversion) {
      rar->sconv_default =
          archive_string_default_conversion_for_read(
            &(a->archive));
      rar->init_default_conversion = 1;
    }
    sconv = rar->sconv_default;
  }


  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);
  p = h;
  memcpy(&rar_header, p, sizeof(rar_header));
  rar->file_flags = archive_le16dec(rar_header.flags);
  header_size = archive_le16dec(rar_header.size);
  if (header_size < (int64_t)sizeof(file_header) + 7) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid header size");
    return (ARCHIVE_FATAL);
  }
  crc32_val = crc32(0, (const unsigned char *)p + 2, 7 - 2);
  __archive_read_consume(a, 7);

  if (!(rar->file_flags & FHD_SOLID))
  {
    rar->compression_method = 0;
    rar->packed_size = 0;
    rar->unp_size = 0;
    rar->mtime = 0;
    rar->ctime = 0;
    rar->atime = 0;
    rar->arctime = 0;
    rar->mode = 0;
    memset(&rar->salt, 0, sizeof(rar->salt));
    rar->atime = 0;
    rar->ansec = 0;
    rar->ctime = 0;
    rar->cnsec = 0;
    rar->mtime = 0;
    rar->mnsec = 0;
    rar->arctime = 0;
    rar->arcnsec = 0;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR solid archive support unavailable.");
    return (ARCHIVE_FATAL);
  }

  if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);

  /* File Header CRC check. */
  crc32_val = crc32(crc32_val, h, (unsigned)(header_size - 7));
  if ((crc32_val & 0xffff) != archive_le16dec(rar_header.crc)) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Header CRC error");
    return (ARCHIVE_FATAL);
  }
  /* If no CRC error, Go on parsing File Header. */
  p = h;
  endp = p + header_size - 7;
  memcpy(&file_header, p, sizeof(file_header));
  p += sizeof(file_header);

  rar->compression_method = file_header.method;

  ttime = archive_le32dec(file_header.file_time);
  rar->mtime = get_time(ttime);

  rar->file_crc = archive_le32dec(file_header.file_crc);

  if (rar->file_flags & FHD_PASSWORD)
  {
	archive_entry_set_is_data_encrypted(entry, 1);
	rar->has_encrypted_entries = 1;
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR encryption support unavailable.");
    /* Since it is only the data part itself that is encrypted we can at least
       extract information about the currently processed entry and don't need
       to return ARCHIVE_FATAL here. */
    /*return (ARCHIVE_FATAL);*/
  }

  if (rar->file_flags & FHD_LARGE)
  {
    memcpy(packed_size, file_header.pack_size, 4);
    memcpy(packed_size + 4, p, 4); /* High pack size */
    p += 4;
    memcpy(unp_size, file_header.unp_size, 4);
    memcpy(unp_size + 4, p, 4); /* High unpack size */
    p += 4;
    rar->packed_size = archive_le64dec(&packed_size);
    rar->unp_size = archive_le64dec(&unp_size);
  }
  else
  {
    rar->packed_size = archive_le32dec(file_header.pack_size);
    rar->unp_size = archive_le32dec(file_header.unp_size);
  }

  if (rar->packed_size < 0 || rar->unp_size < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid sizes specified.");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_remaining = rar->packed_size;

  /* TODO: RARv3 subblocks contain comments. For now the complete block is
   * consumed at the end.
   */
  if (head_type == NEWSUB_HEAD) {
    size_t distance = p - (const char *)h;
    header_size += rar->packed_size;
    /* Make sure we have the extended data. */
    if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
        return (ARCHIVE_FATAL);
    p = h;
    endp = p + header_size - 7;
    p += distance;
  }

  filename_size = archive_le16dec(file_header.name_size);
  if (p + filename_size > endp) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid filename size");
    return (ARCHIVE_FATAL);
  }
  if (rar->filename_allocated < filename_size * 2 + 2) {
    char *newptr;
    size_t newsize = filename_size * 2 + 2;
    newptr = realloc(rar->filename, newsize);
    if (newptr == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Couldn't allocate memory.");
      return (ARCHIVE_FATAL);
    }
    rar->filename = newptr;
    rar->filename_allocated = newsize;
  }
  filename = rar->filename;
  memcpy(filename, p, filename_size);
  filename[filename_size] = '\0';
  if (rar->file_flags & FHD_UNICODE)
  {
    if (filename_size != strlen(filename))
    {
      unsigned char highbyte, flagbits, flagbyte;
      unsigned fn_end, offset;

      end = filename_size;
      fn_end = filename_size * 2;
      filename_size = 0;
      offset = (unsigned)strlen(filename) + 1;
      highbyte = *(p + offset++);
      flagbits = 0;
      flagbyte = 0;
      while (offset < end && filename_size < fn_end)
      {
        if (!flagbits)
        {
          flagbyte = *(p + offset++);
          flagbits = 8;
        }

        flagbits -= 2;
        switch((flagbyte >> flagbits) & 3)
        {
          case 0:
            filename[filename_size++] = '\0';
            filename[filename_size++] = *(p + offset++);
            break;
          case 1:
            filename[filename_size++] = highbyte;
            filename[filename_size++] = *(p + offset++);
            break;
          case 2:
            filename[filename_size++] = *(p + offset + 1);
            filename[filename_size++] = *(p + offset);
            offset += 2;
            break;
          case 3:
          {
            char extra, high;
            uint8_t length = *(p + offset++);

            if (length & 0x80) {
              extra = *(p + offset++);
              high = (char)highbyte;
            } else
              extra = high = 0;
            length = (length & 0x7f) + 2;
            while (length && filename_size < fn_end) {
              unsigned cp = filename_size >> 1;
              filename[filename_size++] = high;
              filename[filename_size++] = p[cp] + extra;
              length--;
            }
          }
          break;
        }
      }
      if (filename_size > fn_end) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid filename");
        return (ARCHIVE_FATAL);
      }
      filename[filename_size++] = '\0';
      /*
       * Do not increment filename_size here as the computations below
       * add the space for the terminating NUL explicitly.
       */
      filename[filename_size] = '\0';

      /* Decoded unicode form is UTF-16BE, so we have to update a string
       * conversion object for it. */
      if (rar->sconv_utf16be == NULL) {
        rar->sconv_utf16be = archive_string_conversion_from_charset(
           &a->archive, "UTF-16BE", 1);
        if (rar->sconv_utf16be == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf16be;

      strp = filename;
      while (memcmp(strp, "\x00\x00", 2))
      {
        if (!memcmp(strp, "\x00\\", 2))
          *(strp + 1) = '/';
        strp += 2;
      }
      p += offset;
    } else {
      /*
       * If FHD_UNICODE is set but no unicode data, this file name form
       * is UTF-8, so we have to update a string conversion object for
       * it accordingly.
       */
      if (rar->sconv_utf8 == NULL) {
        rar->sconv_utf8 = archive_string_conversion_from_charset(
           &a->archive, "UTF-8", 1);
        if (rar->sconv_utf8 == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf8;
      while ((strp = strchr(filename, '\\')) != NULL)
        *strp = '/';
      p += filename_size;
    }
  }
  else
  {
    fn_sconv = sconv;
    while ((strp = strchr(filename, '\\')) != NULL)
      *strp = '/';
    p += filename_size;
  }

  /* Split file in multivolume RAR. No more need to process header. */
  if (rar->filename_save &&
    filename_size == rar->filename_save_size &&
    !memcmp(rar->filename, rar->filename_save, filename_size + 1))
  {
    __archive_read_consume(a, header_size - 7);
    rar->cursor++;
    if (rar->cursor >= rar->nodes)
    {
      rar->nodes++;
      if ((rar->dbo =
        realloc(rar->dbo, sizeof(*rar->dbo) * rar->nodes)) == NULL)
      {
        archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
        return (ARCHIVE_FATAL);
      }
      rar->dbo[rar->cursor].header_size = header_size;
      rar->dbo[rar->cursor].start_offset = -1;
      rar->dbo[rar->cursor].end_offset = -1;
    }
    if (rar->dbo[rar->cursor].start_offset < 0)
    {
      rar->dbo[rar->cursor].start_offset = a->filter->position;
      rar->dbo[rar->cursor].end_offset = rar->dbo[rar->cursor].start_offset +
        rar->packed_size;
    }
    return ret;
  }

  rar->filename_save = (char*)realloc(rar->filename_save,
                                      filename_size + 1);
  memcpy(rar->filename_save, rar->filename, filename_size + 1);
  rar->filename_save_size = filename_size;

  /* Set info for seeking */
  free(rar->dbo);
  if ((rar->dbo = calloc(1, sizeof(*rar->dbo))) == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
    return (ARCHIVE_FATAL);
  }
  rar->dbo[0].header_size = header_size;
  rar->dbo[0].start_offset = -1;
  rar->dbo[0].end_offset = -1;
  rar->cursor = 0;
  rar->nodes = 1;

  if (rar->file_flags & FHD_SALT)
  {
    if (p + 8 > endp) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
    memcpy(rar->salt, p, 8);
    p += 8;
  }

  if (rar->file_flags & FHD_EXTTIME) {
    if (read_exttime(p, rar, endp) < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
  }

  __archive_read_consume(a, header_size - 7);
  rar->dbo[0].start_offset = a->filter->position;
  rar->dbo[0].end_offset = rar->dbo[0].start_offset + rar->packed_size;

  switch(file_header.host_os)
  {
  case OS_MSDOS:
  case OS_OS2:
  case OS_WIN32:
    rar->mode = archive_le32dec(file_header.file_attr);
    if (rar->mode & FILE_ATTRIBUTE_DIRECTORY)
      rar->mode = AE_IFDIR | S_IXUSR | S_IXGRP | S_IXOTH;
    else
      rar->mode = AE_IFREG;
    rar->mode |= S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    break;

  case OS_UNIX:
  case OS_MAC_OS:
  case OS_BEOS:
    rar->mode = archive_le32dec(file_header.file_attr);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unknown file attributes from RAR file's host OS");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_uncopied = rar->bytes_unconsumed = 0;
  rar->lzss.position = rar->offset = 0;
  rar->offset_seek = 0;
  rar->dictionary_size = 0;
  rar->offset_outgoing = 0;
  rar->br.cache_avail = 0;
  rar->br.avail_in = 0;
  rar->crc_calculated = 0;
  rar->entry_eof = 0;
  rar->valid = 1;
  rar->is_ppmd_block = 0;
  rar->start_new_table = 1;
  free(rar->unp_buffer);
  rar->unp_buffer = NULL;
  rar->unp_offset = 0;
  rar->unp_buffer_size = UNP_BUFFER_SIZE;
  memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context);
  rar->ppmd_valid = rar->ppmd_eod = 0;

  /* Don't set any archive entries for non-file header types */
  if (head_type == NEWSUB_HEAD)
    return ret;

  archive_entry_set_mtime(entry, rar->mtime, rar->mnsec);
  archive_entry_set_ctime(entry, rar->ctime, rar->cnsec);
  archive_entry_set_atime(entry, rar->atime, rar->ansec);
  archive_entry_set_size(entry, rar->unp_size);
  archive_entry_set_mode(entry, rar->mode);

  if (archive_entry_copy_pathname_l(entry, filename, filename_size, fn_sconv))
  {
    if (errno == ENOMEM)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Can't allocate memory for Pathname");
      return (ARCHIVE_FATAL);
    }
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Pathname cannot be converted from %s to current locale.",
                      archive_string_conversion_charset_name(fn_sconv));
    ret = (ARCHIVE_WARN);
  }

  if (((rar->mode) & AE_IFMT) == AE_IFLNK)
  {
    /* Make sure a symbolic-link file does not have its body. */
    rar->bytes_remaining = 0;
    archive_entry_set_size(entry, 0);

    /* Read a symbolic-link name. */
    if ((ret2 = read_symlink_stored(a, entry, sconv)) < (ARCHIVE_WARN))
      return ret2;
    if (ret > ret2)
      ret = ret2;
  }

  if (rar->bytes_remaining == 0)
    rar->entry_eof = 1;

  return ret;
}